

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFindPackageCommand.cxx
# Opt level: O0

void __thiscall cmFindPackageCommand::ComputePrefixes(cmFindPackageCommand *this)

{
  cmFindPackageCommand *this_local;
  
  FillPrefixesPackageRedirect(this);
  if (((this->super_cmFindCommon).NoDefaultPath & 1U) == 0) {
    if (((this->super_cmFindCommon).NoPackageRootPath & 1U) == 0) {
      FillPrefixesPackageRoot(this);
    }
    if (((this->super_cmFindCommon).NoCMakePath & 1U) == 0) {
      FillPrefixesCMakeVariable(this);
    }
    if (((this->super_cmFindCommon).NoCMakeEnvironmentPath & 1U) == 0) {
      FillPrefixesCMakeEnvironment(this);
    }
  }
  FillPrefixesUserHints(this);
  if (((this->super_cmFindCommon).NoDefaultPath & 1U) == 0) {
    if (((this->super_cmFindCommon).NoSystemEnvironmentPath & 1U) == 0) {
      FillPrefixesSystemEnvironment(this);
    }
    if ((this->NoUserRegistry & 1U) == 0) {
      FillPrefixesUserRegistry(this);
    }
    if (((this->super_cmFindCommon).NoCMakeSystemPath & 1U) == 0) {
      FillPrefixesCMakeSystemVariable(this);
    }
    if ((this->NoSystemRegistry & 1U) == 0) {
      FillPrefixesSystemRegistry(this);
    }
  }
  FillPrefixesUserGuess(this);
  cmFindCommon::ComputeFinalPaths(&this->super_cmFindCommon,No);
  return;
}

Assistant:

void cmFindPackageCommand::ComputePrefixes()
{
  this->FillPrefixesPackageRedirect();

  if (!this->NoDefaultPath) {
    if (!this->NoPackageRootPath) {
      this->FillPrefixesPackageRoot();
    }
    if (!this->NoCMakePath) {
      this->FillPrefixesCMakeVariable();
    }
    if (!this->NoCMakeEnvironmentPath) {
      this->FillPrefixesCMakeEnvironment();
    }
  }

  this->FillPrefixesUserHints();

  if (!this->NoDefaultPath) {
    if (!this->NoSystemEnvironmentPath) {
      this->FillPrefixesSystemEnvironment();
    }
    if (!this->NoUserRegistry) {
      this->FillPrefixesUserRegistry();
    }
    if (!this->NoCMakeSystemPath) {
      this->FillPrefixesCMakeSystemVariable();
    }
    if (!this->NoSystemRegistry) {
      this->FillPrefixesSystemRegistry();
    }
  }
  this->FillPrefixesUserGuess();

  this->ComputeFinalPaths(IgnorePaths::No);
}